

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O3

_Bool ckh_search(ckh_t *ckh,void *searchkey,void **key,void **data)

{
  size_t sVar1;
  
  sVar1 = ckh_isearch(ckh,searchkey);
  if (sVar1 != 0xffffffffffffffff) {
    if (key != (void **)0x0) {
      *key = ckh->tab[sVar1].key;
    }
    if (data != (void **)0x0) {
      *data = ckh->tab[sVar1].data;
    }
  }
  return sVar1 == 0xffffffffffffffff;
}

Assistant:

bool
ckh_search(ckh_t *ckh, const void *searchkey, void **key, void **data) {
	size_t cell;

	assert(ckh != NULL);

	cell = ckh_isearch(ckh, searchkey);
	if (cell != SIZE_T_MAX) {
		if (key != NULL) {
			*key = (void *)ckh->tab[cell].key;
		}
		if (data != NULL) {
			*data = (void *)ckh->tab[cell].data;
		}
		return false;
	}

	return true;
}